

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O3

void __thiscall
QGraphicsProxyWidgetPrivate::setWidget_helper
          (QGraphicsProxyWidgetPrivate *this,QWidget *newWidget,bool autoShow)

{
  QGraphicsItem *pQVar1;
  Data *pDVar2;
  QGraphicsItem *pQVar3;
  QGraphicsProxyWidgetPrivate *this_00;
  QWidgetPrivate *this_01;
  long lVar4;
  double dVar5;
  double dVar6;
  QMarginsF margins;
  int *piVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  LayoutDirection direction;
  QWExtra *pQVar11;
  Data *pDVar12;
  QStyle *style;
  QSize QVar13;
  QObject *pQVar14;
  QWidget *pQVar15;
  QGraphicsItem **ppQVar16;
  char *pcVar17;
  QWidget *pQVar18;
  QObject *pQVar19;
  QObject *pQVar20;
  QObject *pQVar21;
  QGraphicsItem **ppQVar22;
  QGraphicsItem *this_02;
  long in_FS_OFFSET;
  QMargins QVar23;
  QObject local_a0 [8];
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  char *pcStack_60;
  QList<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.q_ptr;
  pDVar2 = (this->widget).wp.d;
  this_02 = pQVar1 + -1;
  if (pQVar1 == (QGraphicsItem *)0x0) {
    this_02 = (QGraphicsItem *)0x0;
  }
  if (pDVar2 != (Data *)0x0) {
    pQVar18 = (QWidget *)(this->widget).wp.value;
    pQVar15 = (QWidget *)0x0;
    if (*(int *)(pDVar2 + 4) != 0) {
      pQVar15 = pQVar18;
    }
    if (pQVar15 == newWidget) goto LAB_005f9634;
    if (pQVar18 != (QWidget *)0x0 && *(int *)(pDVar2 + 4) != 0) {
      if (*(int *)(pDVar2 + 4) == 0) {
        pQVar18 = (QWidget *)0x0;
      }
      QObject::disconnect(&pQVar18->super_QObject,"2destroyed()",(QObject *)this_02,
                          "1_q_removeWidgetSlot()");
      QObject::removeEventFilter((this->widget).wp.value);
      QWidget::setAttribute((QWidget *)(this->widget).wp.value,WA_DontShowOnScreen,false);
      *(undefined8 *)(*(long *)(*(long *)((this->widget).wp.value + 8) + 0x78) + 0x10) = 0;
      (*(this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate._vptr_QGraphicsItemPrivate
        [5])(this,(ulong)(this->super_QGraphicsWidgetPrivate).inheritedFontResolveMask);
      (*(this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate._vptr_QGraphicsItemPrivate
        [6])(this,(ulong)(this->super_QGraphicsWidgetPrivate).inheritedPaletteResolveMask);
      QWidget::update((QWidget *)(this->widget).wp.value);
      pQVar1 = this_02 + 1;
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
      QGraphicsItem::childItems(&local_58,pQVar1);
      if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
        ppQVar22 = local_58.d.ptr + local_58.d.size;
        ppQVar16 = local_58.d.ptr;
        do {
          pQVar3 = *ppQVar16;
          iVar9 = (*((pQVar3->d_ptr).d)->_vptr_QGraphicsItemPrivate[7])();
          if ((char)iVar9 != '\0') {
            this_00 = (QGraphicsProxyWidgetPrivate *)(pQVar3->d_ptr).d;
            pDVar2 = (this_00->widget).wp.d;
            if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
              pQVar19 = (QObject *)0x0;
            }
            else {
              pQVar19 = (this_00->widget).wp.value;
            }
            pDVar12 = (this->widget).wp.d;
            pQVar14 = (this->widget).wp.value;
            do {
              pQVar20 = pQVar19;
              if ((pQVar20 == (QObject *)0x0) ||
                 (*(QObject **)(*(long *)(pQVar20 + 8) + 0x10) == (QObject *)0x0)) break;
              if (pDVar12 == (Data *)0x0) {
                pQVar21 = (QObject *)0x0;
              }
              else {
                pQVar21 = pQVar14;
                if (*(int *)(pDVar12 + 4) == 0) {
                  pQVar21 = (QObject *)0x0;
                }
              }
              pQVar19 = *(QObject **)(*(long *)(pQVar20 + 8) + 0x10);
            } while (pQVar21 != pQVar20);
            if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
               ((this_00->widget).wp.value != (QObject *)0x0)) {
              if (pDVar12 == (Data *)0x0) {
                pQVar14 = (QObject *)0x0;
              }
              else if (*(int *)(pDVar12 + 4) == 0) {
                pQVar14 = (QObject *)0x0;
              }
              if (pQVar14 == pQVar20) {
                setWidget_helper(this_00,(QWidget *)0x0,true);
                (*pQVar3[-1]._vptr_QGraphicsItem[4])(pQVar3 + -1);
              }
            }
          }
          ppQVar16 = ppQVar16 + 1;
        } while (ppQVar16 != ppQVar22);
      }
      pDVar2 = (this->widget).wp.d;
      (this->widget).wp.d = (Data *)0x0;
      (this->widget).wp.value = (QObject *)0x0;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar2 = *(int *)pDVar2 + -1;
        UNLOCK();
        if (*(int *)pDVar2 == 0) {
          operator_delete(pDVar2);
        }
      }
      QGraphicsItem::unsetCursor(pQVar1);
      QGraphicsItem::setAcceptHoverEvents(pQVar1,false);
      if (newWidget == (QWidget *)0x0) {
        local_68 = 0;
        uStack_64 = 0;
        pcStack_60 = (char *)0x0;
        local_78.data = 0;
        uStack_74 = 0;
        uStack_70 = 0;
        uStack_6c = 0;
        QGraphicsItem::update(pQVar1,(QRectF *)&local_78.bits);
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
        }
      }
    }
  }
  if (newWidget == (QWidget *)0x0) goto LAB_005f9634;
  this_01 = *(QWidgetPrivate **)&newWidget->field_0x8;
  if ((((newWidget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
     ((lVar4 = *(long *)(*(long *)(*(long *)&this_01->field_0x10 + 8) + 0x78), lVar4 == 0 ||
      (*(long *)(lVar4 + 0x10) == 0)))) {
    pcVar17 = 
    "QGraphicsProxyWidget::setWidget: cannot embed widget %p which is not a toplevel widget, and is not a child of an embedded widget"
    ;
  }
  else {
    pQVar11 = (this_01->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
              _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
              super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if (pQVar11 == (QWExtra *)0x0) {
      QWidgetPrivate::createExtra(this_01);
      pQVar11 = *(QWExtra **)(*(long *)&newWidget->field_0x8 + 0x78);
    }
    if ((QGraphicsItem *)pQVar11->proxyWidget == (QGraphicsItem *)0x0) {
      pQVar11->proxyWidget = (QGraphicsProxyWidget *)this_02;
      QWidget::setAttribute(newWidget,WA_DontShowOnScreen,true);
      QWidget::ensurePolished(newWidget);
      QWidget::setAttribute(newWidget,WA_QuitOnClose,false);
      pQVar1 = this_02 + 1;
      QGraphicsItem::setAcceptHoverEvents(pQVar1,true);
      uVar10 = newWidget->data->widget_attributes;
      if ((uVar10 >> 9 & 1) != 0) {
        QGraphicsWidget::setAttribute((QGraphicsWidget *)this_02,WA_NoSystemBackground,true);
        uVar10 = newWidget->data->widget_attributes;
      }
      if ((uVar10 & 0x10) != 0) {
        QGraphicsWidget::setAttribute((QGraphicsWidget *)this_02,WA_OpaquePaintEvent,true);
      }
      pDVar12 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&newWidget->super_QObject);
      pDVar2 = (this->widget).wp.d;
      (this->widget).wp.d = pDVar12;
      (this->widget).wp.value = &newWidget->super_QObject;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar2 = *(int *)pDVar2 + -1;
        UNLOCK();
        if (*(int *)pDVar2 == 0) {
          operator_delete(pDVar2);
        }
      }
      this->field_0x244 = 0xaa;
      if (((autoShow) &&
          (bVar8 = QWidget::testAttribute_helper(newWidget,WA_WState_ExplicitShowHide), !bVar8)) ||
         ((newWidget->data->widget_attributes & 0x10000) == 0)) {
        QWidget::show(newWidget);
      }
      bVar8 = QWidget::testAttribute_helper(newWidget,WA_SetCursor);
      if (bVar8) {
        QWidget::cursor((QWidget *)&local_78.bits);
        QGraphicsItem::setCursor(pQVar1,(QCursor *)&local_78.bits);
        QCursor::~QCursor((QCursor *)&local_78.bits);
      }
      QGraphicsItem::setEnabled(pQVar1,(newWidget->data->widget_attributes & 1) == 0);
      QGraphicsItem::setVisible
                (pQVar1,SUB21((ushort)(short)newWidget->data->widget_attributes >> 0xf,0));
      direction = QWidget::layoutDirection(newWidget);
      QGraphicsWidget::setLayoutDirection((QGraphicsWidget *)this_02,direction);
      bVar8 = QWidget::testAttribute_helper(newWidget,WA_SetStyle);
      if (bVar8) {
        style = QWidget::style((QWidget *)(this->widget).wp.value);
        QGraphicsWidget::setStyle((QGraphicsWidget *)this_02,style);
      }
      (*(this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate._vptr_QGraphicsItemPrivate
        [5])(this,(ulong)(this->super_QGraphicsWidgetPrivate).inheritedFontResolveMask);
      (*(this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate._vptr_QGraphicsItemPrivate
        [6])(this,(ulong)(this->super_QGraphicsWidgetPrivate).inheritedPaletteResolveMask);
      bVar8 = QWidget::testAttribute_helper(newWidget,WA_Resized);
      if (!bVar8) {
        QWidget::adjustSize(newWidget);
      }
      QVar23 = QWidget::contentsMargins(newWidget);
      local_98 = (double)QVar23.m_left.m_i.m_i;
      dStack_90 = (double)QVar23.m_top.m_i.m_i;
      local_88 = (double)QVar23.m_right.m_i.m_i;
      dStack_80 = (double)QVar23.m_bottom.m_i.m_i;
      margins.m_top = dStack_90;
      margins.m_left = local_98;
      margins.m_right = local_88;
      margins.m_bottom = dStack_80;
      QGraphicsWidget::setContentsMargins((QGraphicsWidget *)this_02,margins);
      QWidget::windowTitle((QString *)&local_78.bits,newWidget);
      QGraphicsWidget::setWindowTitle((QGraphicsWidget *)this_02,(QString *)&local_78.bits);
      piVar7 = (int *)CONCAT44(uStack_74,local_78.data);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78.data),2,0x10);
        }
      }
      pQVar1 = this_02 + 2;
      local_78.bits = (Bits)QWidget::sizePolicy(newWidget);
      QGraphicsLayoutItem::setSizePolicy
                ((QGraphicsLayoutItem *)pQVar1,(QSizePolicy *)&local_78.bits);
      QVar13 = QWidget::minimumSize(newWidget);
      dVar5 = -1.0;
      dVar6 = dVar5;
      if ((ulong)QVar13 >> 0x20 != 0 || QVar13.wd.m_i.m_i != 0) {
        dVar5 = (double)QVar13.wd.m_i.m_i;
        dVar6 = (double)QVar13.ht.m_i.m_i;
      }
      local_78.data = SUB84(dVar5,0);
      uStack_74 = (undefined4)((ulong)dVar5 >> 0x20);
      uStack_70 = SUB84(dVar6,0);
      uStack_6c = (undefined4)((ulong)dVar6 >> 0x20);
      QGraphicsLayoutItem::setMinimumSize((QGraphicsLayoutItem *)pQVar1,(QSizeF *)&local_78.bits);
      QVar13 = QWidget::maximumSize(newWidget);
      dVar6 = -1.0;
      dVar5 = dVar6;
      if ((ulong)QVar13 >> 0x20 != 0 || QVar13.wd.m_i.m_i != 0) {
        dVar6 = (double)QVar13.wd.m_i.m_i;
        dVar5 = (double)QVar13.ht.m_i.m_i;
      }
      local_78.data = SUB84(dVar6,0);
      uStack_74 = (undefined4)((ulong)dVar6 >> 0x20);
      uStack_70 = SUB84(dVar5,0);
      uStack_6c = (undefined4)((ulong)dVar5 >> 0x20);
      QGraphicsLayoutItem::setMaximumSize((QGraphicsLayoutItem *)pQVar1,(QSizeF *)&local_78.bits);
      updateProxyGeometryFromWidget(this);
      updateProxyInputMethodAcceptanceFromWidget(this);
      QObject::installEventFilter(&newWidget->super_QObject);
      QObject::connect(local_a0,(char *)newWidget,(QObject *)"2destroyed()",(char *)this_02,0x6f31d1
                      );
      QMetaObject::Connection::~Connection((Connection *)local_a0);
      this->field_0x244 = 0;
      goto LAB_005f9634;
    }
    if ((QGraphicsItem *)pQVar11->proxyWidget == this_02) goto LAB_005f9634;
    pcVar17 = "QGraphicsProxyWidget::setWidget: cannot embed widget %p; already embedded";
  }
  pcStack_60 = "default";
  uStack_64 = 0;
  local_68 = 0;
  uStack_6c = 0;
  uStack_70 = 0;
  uStack_74 = 0;
  local_78.data = 2;
  QMessageLogger::warning((char *)&local_78.data,pcVar17,newWidget);
LAB_005f9634:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidgetPrivate::setWidget_helper(QWidget *newWidget, bool autoShow)
{
    Q_Q(QGraphicsProxyWidget);
    if (newWidget == widget)
        return;
    if (widget) {
        QObject::disconnect(widget, SIGNAL(destroyed()), q, SLOT(_q_removeWidgetSlot()));
        widget->removeEventFilter(q);
        widget->setAttribute(Qt::WA_DontShowOnScreen, false);
        widget->d_func()->extra->proxyWidget = nullptr;
        resolveFont(inheritedFontResolveMask);
        resolvePalette(inheritedPaletteResolveMask);
        widget->update();

        const auto childItems = q->childItems();
        for (QGraphicsItem *child : childItems) {
            if (child->d_ptr->isProxyWidget()) {
                QGraphicsProxyWidget *childProxy = static_cast<QGraphicsProxyWidget *>(child);
                QWidget *parent = childProxy->widget();
                while (parent && parent->parentWidget()) {
                    if (parent == widget)
                        break;
                    parent = parent->parentWidget();
                }
                if (!childProxy->widget() || parent != widget)
                    continue;
                childProxy->setWidget(nullptr);
                delete childProxy;
            }
        }

        widget = nullptr;
#ifndef QT_NO_CURSOR
        q->unsetCursor();
#endif
        q->setAcceptHoverEvents(false);
        if (!newWidget)
            q->update();
    }
    if (!newWidget)
        return;
    if (!newWidget->isWindow()) {
        const auto &extra = newWidget->parentWidget()->d_func()->extra;
        if (!extra || !extra->proxyWidget)  {
            qWarning("QGraphicsProxyWidget::setWidget: cannot embed widget %p "
                     "which is not a toplevel widget, and is not a child of an embedded widget", newWidget);
            return;
        }
    }

    // Register this proxy within the widget's private.
    // ### This is a bit backdoorish
    QWExtra *extra = newWidget->d_func()->extra.get();
    if (!extra) {
        newWidget->d_func()->createExtra();
        extra = newWidget->d_func()->extra.get();
    }
    QGraphicsProxyWidget **proxyWidget = &extra->proxyWidget;
    if (*proxyWidget) {
        if (*proxyWidget != q) {
            qWarning("QGraphicsProxyWidget::setWidget: cannot embed widget %p"
                        "; already embedded", newWidget);
        }
        return;
    }
    *proxyWidget = q;

    newWidget->setAttribute(Qt::WA_DontShowOnScreen);
    newWidget->ensurePolished();
    // Do not wait for this widget to close before the app closes ###
    // shouldn't this widget inherit the attribute?
    newWidget->setAttribute(Qt::WA_QuitOnClose, false);
    q->setAcceptHoverEvents(true);

    if (newWidget->testAttribute(Qt::WA_NoSystemBackground))
        q->setAttribute(Qt::WA_NoSystemBackground);
    if (newWidget->testAttribute(Qt::WA_OpaquePaintEvent))
        q->setAttribute(Qt::WA_OpaquePaintEvent);

    widget = newWidget;

    // Changes only go from the widget to the proxy.
    enabledChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
    visibleChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
    posChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
    sizeChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;

    if ((autoShow && !newWidget->testAttribute(Qt::WA_WState_ExplicitShowHide)) || !newWidget->testAttribute(Qt::WA_WState_Hidden)) {
        newWidget->show();
    }

    // Copy the state from the widget onto the proxy.
#ifndef QT_NO_CURSOR
    if (newWidget->testAttribute(Qt::WA_SetCursor))
        q->setCursor(widget->cursor());
#endif
    q->setEnabled(newWidget->isEnabled());
    q->setVisible(newWidget->isVisible());
    q->setLayoutDirection(newWidget->layoutDirection());
    if (newWidget->testAttribute(Qt::WA_SetStyle))
        q->setStyle(widget->style());

    resolveFont(inheritedFontResolveMask);
    resolvePalette(inheritedPaletteResolveMask);

    if (!newWidget->testAttribute(Qt::WA_Resized))
        newWidget->adjustSize();

    q->setContentsMargins(newWidget->contentsMargins());
    q->setWindowTitle(newWidget->windowTitle());

    // size policies and constraints..
    q->setSizePolicy(newWidget->sizePolicy());
    QSize sz = newWidget->minimumSize();
    q->setMinimumSize(sz.isNull() ? QSizeF() : QSizeF(sz));
    sz = newWidget->maximumSize();
    q->setMaximumSize(sz.isNull() ? QSizeF() : QSizeF(sz));

    updateProxyGeometryFromWidget();

    updateProxyInputMethodAcceptanceFromWidget();

    // Hook up the event filter to keep the state up to date.
    newWidget->installEventFilter(q);
    QObject::connect(newWidget, SIGNAL(destroyed()), q, SLOT(_q_removeWidgetSlot()));

    // Changes no longer go only from the widget to the proxy.
    enabledChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
    visibleChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
    posChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
    sizeChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
}